

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ReferenceParams *pRVar6;
  ulong uVar7;
  bool bVar8;
  int i;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int z;
  ConstPixelBufferAccess *pCVar12;
  int y;
  int lodOffsNdx;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Vector<bool,_3> res_2;
  Vec2 clampedLod;
  Vec2 coordDy;
  Vector<float,_3> res;
  IVec2 srcSize;
  Vec2 coordDx;
  Vec3 triW [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vector<float,_2> res_9;
  Vec4 resPix;
  Vec4 refPix;
  Vec2 lodBias;
  Vec2 lodOffsets [4];
  undefined8 local_238;
  Vec2 local_230;
  float local_224;
  Vec4 local_220;
  float local_210 [4];
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  ulong local_1f0;
  float local_1e8 [4];
  ConstPixelBufferAccess *local_1d8;
  Vec2 local_1d0;
  undefined4 local_1c8;
  int local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  int local_1b0 [2];
  ReferenceParams *local_1a8;
  float local_1a0 [2];
  int local_198;
  PixelBufferAccess *local_190;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168 [8];
  float local_148 [8];
  float local_128 [6];
  float local_110 [2];
  undefined1 local_108 [32];
  ConstPixelBufferAccess local_e8;
  Texture2DView *local_c0;
  ConstPixelBufferAccess *local_b8;
  float afStack_b0 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  float local_58 [10];
  
  local_1b0[1] = 0;
  local_1b0[0] = 0;
  if (0 < src->m_numLevels) {
    local_1b0[0] = (src->m_levels->m_size).m_data[0];
  }
  local_128[0] = *texCoord;
  local_148[0] = texCoord[1];
  local_128[1] = texCoord[2];
  local_128[2] = texCoord[4];
  local_128[3] = texCoord[6];
  local_148[1] = texCoord[3];
  local_148[2] = texCoord[5];
  local_148[3] = texCoord[7];
  if (0 < src->m_numLevels) {
    local_1b0[1] = (src->m_levels->m_size).m_data[1];
  }
  local_200 = (float)(result->m_size).m_data[0];
  local_224 = (float)(result->m_size).m_data[1];
  local_168[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_168[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_168[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_168[3] = (sampleParams->super_RenderParams).w.m_data[3];
  fVar13 = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar13 = (sampleParams->super_RenderParams).bias;
  }
  lVar9 = 0;
  do {
    afStack_b0[lVar9] = fVar13;
    lVar9 = lVar9 + 1;
  } while (lVar9 == 1);
  local_58[0] = -1.0;
  local_58[1] = 0.0;
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_e8.m_format.order = 0xff00ff00;
  local_1d8 = result;
  local_1a8 = sampleParams;
  local_190 = errorMask;
  local_168[4] = local_168[2];
  local_168[5] = local_168[1];
  local_148[4] = local_148[2];
  local_148[5] = local_148[1];
  local_128[4] = local_128[2];
  local_128[5] = local_128[1];
  local_b8 = reference;
  tcu::RGBA::toVec((RGBA *)local_108);
  tcu::clear(local_190,(Vec4 *)local_108);
  if ((local_1d8->m_size).m_data[1] < 1) {
    local_1f0 = 0;
  }
  else {
    local_e8.m_data = &local_1a8->sampler;
    local_1f0 = 0;
    z = 0;
    pCVar12 = local_1d8;
    local_c0 = src;
    do {
      if (0 < (pCVar12->m_size).m_data[0]) {
        fVar13 = (float)z + 0.5;
        local_98 = ZEXT416((uint)fVar13);
        local_88 = ZEXT416((uint)(local_224 - fVar13));
        local_a8 = ZEXT416((uint)(fVar13 / local_224));
        local_188 = 1.0 - fVar13 / local_224;
        y = 0;
        local_1c0 = z;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_108,(int)pCVar12,y,z);
          tcu::ConstPixelBufferAccess::getPixel(&local_e8,(int)local_b8,y,z);
          local_1a0[0] = (float)local_e8.m_format.type;
          local_1a0[1] = (float)local_e8.m_size.m_data[0];
          local_198 = local_e8.m_size.m_data[1];
          local_1e8[0] = (float)local_108._4_4_;
          local_1e8[1] = (float)local_108._8_4_;
          local_1e8[2] = (float)local_108._12_4_;
          local_1d0.m_data[0] = 0.0;
          local_1d0.m_data[1] = 0.0;
          local_1c8 = 0;
          lVar9 = 0;
          do {
            local_1d0.m_data[lVar9] = local_1a0[lVar9] - local_1e8[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_220.m_data[2] = 0.0;
          local_220.m_data[0] = 0.0;
          local_220.m_data[1] = 0.0;
          lVar9 = 0;
          do {
            fVar13 = local_1d0.m_data[lVar9];
            fVar14 = -fVar13;
            if (-fVar13 <= fVar13) {
              fVar14 = fVar13;
            }
            local_220.m_data[lVar9] = fVar14;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_238 = local_238 & 0xffffffffff000000;
          lVar9 = 0;
          do {
            *(bool *)((long)&local_238 + lVar9) =
                 local_220.m_data[lVar9] <= nonShadowThreshold->m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          if (local_238._0_1_ == (tcu)0x0) {
LAB_008561c9:
            local_1d0.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_220);
            tcu::PixelBufferAccess::setPixel(local_190,&local_220,y,z,0);
            local_1f0 = (ulong)((int)local_1f0 + 1);
          }
          else {
            uVar7 = 0;
            do {
              uVar11 = uVar7;
              if (uVar11 == 2) break;
              uVar7 = uVar11 + 1;
            } while (*(char *)((long)&local_238 + uVar11 + 1) != '\0');
            if (uVar11 < 2) goto LAB_008561c9;
            if (((float)local_108._0_4_ != (float)local_e8.m_format.order) ||
               (NAN((float)local_108._0_4_) || NAN((float)local_e8.m_format.order))) {
              fVar18 = (float)y + 0.5;
              fVar15 = fVar18 / local_200;
              fVar14 = (float)local_a8._0_4_ + fVar15;
              fVar13 = (float)local_a8._0_4_;
              local_1bc = fVar18;
              if (1.0 <= fVar14) {
                fVar15 = 1.0 - fVar15;
                fVar13 = local_188;
                local_1bc = local_200 - fVar18;
              }
              uVar7 = (ulong)(1.0 <= fVar14);
              fVar16 = local_128[uVar7 * 3];
              fVar1 = local_128[uVar7 * 3 + 1];
              fVar17 = (1.0 - fVar15) - fVar13;
              fVar2 = local_168[uVar7 * 3];
              local_1b4 = local_168[uVar7 * 3 + 1];
              fVar3 = local_128[uVar7 * 3 + 2];
              local_1b8 = local_168[uVar7 * 3 + 2];
              fVar20 = fVar15 / local_1b8 + fVar13 / local_1b4 + fVar17 / fVar2;
              fVar4 = local_148[uVar7 * 3];
              fVar5 = local_148[uVar7 * 3 + 1];
              local_184 = local_148[uVar7 * 3 + 2];
              local_1d0.m_data[1] =
                   ((fVar15 * local_184) / local_1b8 +
                   (fVar13 * fVar5) / local_1b4 + (fVar17 * fVar4) / fVar2) / fVar20;
              local_1d0.m_data[0] =
                   ((fVar15 * fVar3) / local_1b8 +
                   (fVar13 * fVar1) / local_1b4 + (fVar17 * fVar16) / fVar2) / fVar20;
              local_1f4 = local_1b4 * local_1b8;
              fVar20 = fVar13 + -1.0;
              local_16c = local_1b8 * local_200;
              fVar19 = (local_200 * fVar20 + fVar18) * local_1f4 -
                       (local_16c * fVar13 + fVar18 * local_1b4) * fVar2;
              local_170 = (fVar1 - fVar16) * local_1b8 + (fVar3 - fVar1) * fVar2;
              local_174 = (fVar16 - fVar3) * local_1b4;
              local_178 = (fVar5 - fVar4) * local_1b8 + (local_184 - fVar5) * fVar2;
              local_17c = (fVar4 - local_184) * local_1b4;
              fVar18 = fVar2 * local_1b4 * local_1b8;
              fVar17 = fVar18 * local_200;
              local_68 = ZEXT416((uint)fVar17);
              fVar19 = fVar19 * fVar19;
              local_220.m_data[1] = ((fVar20 * local_17c + fVar13 * local_178) * fVar17) / fVar19;
              local_220.m_data[0] = ((local_174 * fVar20 + fVar13 * local_170) * fVar17) / fVar19;
              local_78 = -fVar2;
              local_1e8[0] = 0.0;
              local_1e8[1] = 0.0;
              lVar9 = 0;
              do {
                local_1e8[lVar9] = (float)local_1b0[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 == 1);
              local_1a0[0] = 0.0;
              local_1a0[1] = 0.0;
              lVar9 = 0;
              do {
                local_1a0[lVar9] = local_220.m_data[lVar9] * local_1e8[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 == 1);
              fVar13 = fVar15 + -1.0;
              local_180 = local_1b4 * local_224;
              uStack_74 = 0x80000000;
              uStack_70 = 0x80000000;
              uStack_6c = 0x80000000;
              fVar17 = (local_224 * fVar13 + (float)local_98._0_4_) * local_1f4 +
                       (local_180 * fVar15 + (float)local_98._0_4_ * local_1b8) * local_78;
              local_210[3] = (fVar16 - fVar1) * local_1b8;
              local_1f8 = (fVar1 - fVar3) * fVar2 + (fVar3 - fVar16) * local_1b4;
              local_1fc = (fVar5 - local_184) * fVar2 + (local_184 - fVar4) * local_1b4;
              local_210[2] = (fVar4 - fVar5) * local_1b8;
              fVar18 = fVar18 * local_224;
              local_108._16_16_ = ZEXT416((uint)fVar18);
              fVar17 = fVar17 * fVar17;
              local_220.m_data[1] = ((fVar13 * local_210[2] + fVar15 * local_1fc) * fVar18) / fVar17
              ;
              local_220.m_data[0] = ((local_210[3] * fVar13 + fVar15 * local_1f8) * fVar18) / fVar17
              ;
              local_238 = 0;
              lVar9 = 0;
              do {
                *(float *)((long)&local_238 + lVar9 * 4) = (float)local_1b0[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 == 1);
              local_1e8[0] = 0.0;
              local_1e8[1] = 0.0;
              lVar9 = 0;
              do {
                local_1e8[lVar9] =
                     local_220.m_data[lVar9] * *(float *)((long)&local_238 + lVar9 * 4);
                lVar9 = lVar9 + 1;
              } while (lVar9 == 1);
              local_e8.m_size.m_data[2] =
                   ~-(uint)(1.0 <= fVar14) & local_98._0_4_ |
                   -(uint)(1.0 <= fVar14) & local_88._0_4_;
              local_e8.m_pitch.m_data[0] = local_98._4_4_;
              local_e8.m_pitch.m_data[1] = local_98._8_4_;
              local_e8.m_pitch.m_data[2] = local_98._12_4_;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)&local_238,local_1a0[0],local_1a0[1],local_1e8[0],local_1e8[1],
                         lodPrec);
              lVar9 = 0;
              do {
                fVar13 = local_58[lVar9 * 2] + local_1bc;
                fVar14 = local_58[lVar9 * 2 + 1] + (float)local_e8.m_size.m_data[2];
                fVar16 = fVar14 / local_224;
                fVar15 = fVar16 + -1.0;
                fVar18 = (local_200 * fVar15 + fVar13) * local_1f4 +
                         (local_16c * fVar16 + local_1b4 * fVar13) * local_78;
                fVar18 = fVar18 * fVar18;
                local_210[1] = ((fVar15 * local_17c + fVar16 * local_178) * (float)local_68._0_4_) /
                               fVar18;
                local_210[0] = ((local_174 * fVar15 + local_170 * fVar16) * (float)local_68._0_4_) /
                               fVar18;
                local_230.m_data[0] = 0.0;
                local_230.m_data[1] = 0.0;
                lVar10 = 0;
                do {
                  local_230.m_data[lVar10] = (float)local_1b0[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 == 1);
                local_220.m_data[0] = 0.0;
                local_220.m_data[1] = 0.0;
                lVar10 = 0;
                do {
                  local_220.m_data[lVar10] = local_210[lVar10] * local_230.m_data[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 == 1);
                fVar13 = fVar13 / local_200;
                fVar15 = fVar13 + -1.0;
                fVar14 = (local_224 * fVar15 + fVar14) * local_1f4 +
                         (local_180 * fVar13 + fVar14 * local_1b8) * local_78;
                fVar14 = fVar14 * fVar14;
                local_230.m_data[0] =
                     ((local_210[3] * fVar15 + local_1f8 * fVar13) * (float)local_108._16_4_) /
                     fVar14;
                local_230.m_data[1] =
                     ((fVar15 * local_210[2] + fVar13 * local_1fc) * (float)local_108._16_4_) /
                     fVar14;
                local_110[0] = 0.0;
                local_110[1] = 0.0;
                lVar10 = 0;
                do {
                  local_110[lVar10] = (float)local_1b0[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 == 1);
                local_210[0] = 0.0;
                local_210[1] = 0.0;
                lVar10 = 0;
                do {
                  local_210[lVar10] = local_230.m_data[lVar10] * local_110[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 == 1);
                tcu::computeLodBoundsFromDerivates
                          ((tcu *)&local_230,local_220.m_data[0],local_220.m_data[1],local_210[0],
                           local_210[1],lodPrec);
                pRVar6 = local_1a8;
                local_238 = CONCAT44(~-(uint)(local_230.m_data[1] <= local_238._4_4_) &
                                     (uint)local_230.m_data[1] |
                                     (uint)local_238._4_4_ &
                                     -(uint)(local_230.m_data[1] <= local_238._4_4_),
                                     ~-(uint)((float)local_238 <= local_230.m_data[0]) &
                                     (uint)local_230.m_data[0] |
                                     (uint)(float)local_238 &
                                     -(uint)((float)local_238 <= local_230.m_data[0]));
                lVar9 = lVar9 + 1;
              } while (lVar9 != 4);
              local_220.m_data[0] = 0.0;
              local_220.m_data[1] = 0.0;
              lVar9 = 0;
              do {
                local_220.m_data[lVar9] =
                     *(float *)((long)&local_238 + lVar9 * 4) + afStack_b0[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 == 1);
              local_230.m_data[0] = local_1a8->minLod;
              local_230.m_data[1] = local_1a8->maxLod;
              tcu::clampLodBounds((tcu *)local_210,(Vec2 *)&local_220,&local_230,lodPrec);
              bVar8 = tcu::isTexCompareResultValid
                                (local_c0,(Sampler *)local_e8.m_data,comparePrec,&local_1d0,
                                 (Vec2 *)local_210,(pRVar6->super_RenderParams).ref,
                                 (float)local_108._0_4_);
              z = local_1c0;
              if (!bVar8) {
                local_230.m_data[0] = -1.7014636e+38;
                tcu::RGBA::toVec((RGBA *)&local_220);
                z = local_1c0;
                tcu::PixelBufferAccess::setPixel(local_190,&local_220,y,local_1c0,0);
                local_1f0 = (ulong)((int)local_1f0 + 1);
              }
            }
          }
          y = y + 1;
          pCVar12 = local_1d8;
        } while (y < (local_1d8->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (pCVar12->m_size).m_data[1]);
  }
  return (int)local_1f0;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::Texture2DView&			src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const tcu::IVec2	srcSize			= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}